

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector(PlanningUnitMADPDiscrete *this,Index ts)

{
  PlanningUnitMADPDiscrete *this_00;
  PlanningUnitMADPDiscrete *pPVar1;
  long *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Index agentI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts;
  value_type_conflict2 *in_stack_ffffffffffffff98;
  undefined4 local_1c;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d5793);
  local_1c = 0;
  while( true ) {
    this_00 = (PlanningUnitMADPDiscrete *)(ulong)local_1c;
    pPVar1 = (PlanningUnitMADPDiscrete *)(**(code **)(*in_RSI + 0x30))();
    if (pPVar1 <= this_00) break;
    in_stack_ffffffffffffff98 =
         (value_type_conflict2 *)
         GetNrObservationHistories
                   (this_00,(Index)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                    (Index)in_stack_ffffffffffffff98);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
               in_stack_ffffffffffffff98);
    local_1c = local_1c + 1;
  }
  return in_RDI;
}

Assistant:

const vector<size_t> PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector(Index ts) const
{
    vector<size_t> nrOHts; 
    for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        nrOHts.push_back( GetNrObservationHistories(agentI, ts) );
    return nrOHts;
}